

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O0

bool __thiscall
QTranslator::load(QTranslator *this,QString *filename,QString *directory,QString *search_delimiters,
                 QString *suffix)

{
  bool bVar1;
  QTranslatorPrivate *directory_00;
  qsizetype qVar2;
  QStringView *pQVar3;
  QTranslatorPrivate *in_RCX;
  __off_t extraout_RDX;
  __off_t __length;
  __off_t extraout_RDX_00;
  QString *in_R8;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QStringView_&> QVar4;
  const_iterator __end2;
  const_iterator __begin2;
  QString *__range2;
  QTranslatorPrivate *d;
  char16_t *str;
  QChar ch;
  qsizetype rightmost;
  QFileInfo fi;
  QString delims;
  QString realname;
  QStringView fname;
  QString suffixOrDotQM;
  QString prefix;
  undefined4 in_stack_fffffffffffffda8;
  CaseSensitivity in_stack_fffffffffffffdac;
  undefined2 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb2;
  undefined1 in_stack_fffffffffffffdb3;
  CaseSensitivity in_stack_fffffffffffffdb4;
  QString *in_stack_fffffffffffffdb8;
  QStringView *in_stack_fffffffffffffdc0;
  QString *in_stack_fffffffffffffdc8;
  QChar c;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  QTranslatorPrivate *in_stack_fffffffffffffde0;
  QStringView *local_1c8;
  int local_1b4;
  byte local_169;
  qsizetype local_148;
  char16_t local_13a;
  Data *local_138;
  QStringBuilder<QString_&,_QStringView_&> local_130;
  QStringBuilder<QString_&,_QStringView_&> local_108;
  undefined1 *local_c8;
  QArrayDataPointer<char16_t> local_c0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QStringView local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QChar local_34;
  QChar local_32 [5];
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  directory_00 = d_func((QTranslator *)0x42e321);
  QTranslatorPrivate::clear(in_stack_fffffffffffffde0);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x42e364);
  QFileInfo::QFileInfo
            ((QFileInfo *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)),
             in_stack_fffffffffffffdc8);
  c.ucs = (char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
  bVar1 = QFileInfo::isRelative
                    ((QFileInfo *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  QFileInfo::~QFileInfo((QFileInfo *)0x42e39e);
  if (bVar1) {
    QString::operator=((QString *)
                       CONCAT44(in_stack_fffffffffffffdb4,
                                CONCAT13(in_stack_fffffffffffffdb3,
                                         CONCAT12(in_stack_fffffffffffffdb2,
                                                  in_stack_fffffffffffffdb0))),
                       (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    qVar2 = QString::size(&local_28);
    if (qVar2 != 0) {
      QChar::QChar<char16_t,_true>(local_32,L'/');
      bVar1 = QString::endsWith(in_stack_fffffffffffffdb8,c,in_stack_fffffffffffffdb4);
      if (!bVar1) {
        QChar::QChar<char16_t,_true>(&local_34,L'/');
        QString::operator+=((QString *)
                            CONCAT44(in_stack_fffffffffffffdb4,
                                     CONCAT13(in_stack_fffffffffffffdb3,
                                              CONCAT12(in_stack_fffffffffffffdb2,
                                                       in_stack_fffffffffffffdb0))),
                            (QChar)(char16_t)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
      }
    }
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QString::isNull((QString *)0x42e4be);
  if (bVar1) {
    dotQmLiteral();
  }
  else {
    QString::QString((QString *)
                     CONCAT44(in_stack_fffffffffffffdb4,
                              CONCAT13(in_stack_fffffffffffffdb3,
                                       CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  }
  local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x42e551);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QString::isNull((QString *)0x42e582);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_c0,(Data *)0x0,L"_.",2);
    QString::QString((QString *)
                     CONCAT44(in_stack_fffffffffffffdb4,
                              CONCAT13(in_stack_fffffffffffffdb3,
                                       CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_fffffffffffffdb4,
                        CONCAT13(in_stack_fffffffffffffdb3,
                                 CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0))));
  }
  else {
    QString::QString((QString *)
                     CONCAT44(in_stack_fffffffffffffdb4,
                              CONCAT13(in_stack_fffffffffffffdb3,
                                       CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0)
                                      )),
                     (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  }
  do {
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)in_stack_fffffffffffffdc0);
    QVar4 = ::operator+((QString *)
                        CONCAT44(in_stack_fffffffffffffdb4,
                                 CONCAT13(in_stack_fffffffffffffdb3,
                                          CONCAT12(in_stack_fffffffffffffdb2,
                                                   in_stack_fffffffffffffdb0))),
                        (QStringView *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                       );
    local_108 = QVar4;
    ::operator+((QStringBuilder<QString_&,_QStringView_&> *)
                CONCAT44(in_stack_fffffffffffffdb4,
                         CONCAT13(in_stack_fffffffffffffdb3,
                                  CONCAT12(in_stack_fffffffffffffdb2,in_stack_fffffffffffffdb0))),
                (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString_&,_QStringView_&>,_const_QString_&> *)
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QString::operator=((QString *)
                       CONCAT44(in_stack_fffffffffffffdb4,
                                CONCAT13(in_stack_fffffffffffffdb3,
                                         CONCAT12(in_stack_fffffffffffffdb2,
                                                  in_stack_fffffffffffffdb0))),
                       (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    QString::~QString((QString *)0x42e6f1);
    QFileInfo::setFile((QFileInfo *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    bVar1 = QFileInfo::isReadable
                      ((QFileInfo *)
                       CONCAT17(in_stack_fffffffffffffdd7,
                                CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
    if (bVar1) {
      bVar1 = QFileInfo::isFile((QFileInfo *)
                                CONCAT17(in_stack_fffffffffffffdd7,
                                         CONCAT16(in_stack_fffffffffffffdd6,
                                                  in_stack_fffffffffffffdd0)));
      if (!bVar1) goto LAB_0042e7ef;
      local_1b4 = 2;
    }
    else {
LAB_0042e7ef:
      QVar4 = ::operator+((QString *)
                          CONCAT44(in_stack_fffffffffffffdb4,
                                   CONCAT13(in_stack_fffffffffffffdb3,
                                            CONCAT12(in_stack_fffffffffffffdb2,
                                                     in_stack_fffffffffffffdb0))),
                          (QStringView *)
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      local_130 = QVar4;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QStringView_&> *)
                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      QString::operator=((QString *)
                         CONCAT44(in_stack_fffffffffffffdb4,
                                  CONCAT13(in_stack_fffffffffffffdb3,
                                           CONCAT12(in_stack_fffffffffffffdb2,
                                                    in_stack_fffffffffffffdb0))),
                         (QString *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      QString::~QString((QString *)0x42e86a);
      QFileInfo::setFile((QFileInfo *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffdd7 =
           QFileInfo::isReadable
                     ((QFileInfo *)
                      CONCAT17(in_stack_fffffffffffffdd7,
                               CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
      if ((bool)in_stack_fffffffffffffdd7) {
        in_stack_fffffffffffffdd6 =
             QFileInfo::isFile((QFileInfo *)
                               CONCAT17(in_stack_fffffffffffffdd7,
                                        CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0
                                                )));
        if ((bool)in_stack_fffffffffffffdd6) {
          local_1b4 = 2;
          goto LAB_0042ea22;
        }
      }
      local_138 = (Data *)0x0;
      local_1c8 = (QStringView *)QString::begin((QString *)0x42e903);
      pQVar3 = (QStringView *)
               QString::end((QString *)
                            CONCAT44(in_stack_fffffffffffffdb4,
                                     CONCAT13(in_stack_fffffffffffffdb3,
                                              CONCAT12(in_stack_fffffffffffffdb2,
                                                       in_stack_fffffffffffffdb0))));
      __length = extraout_RDX;
      in_stack_fffffffffffffdc0 = pQVar3;
      for (; local_1c8 != pQVar3; local_1c8 = (QStringView *)((long)&local_1c8->m_size + 2)) {
        local_13a = *(char16_t *)&local_1c8->m_size;
        local_148 = QStringView::lastIndexOf
                              ((QStringView *)
                               CONCAT44(in_stack_fffffffffffffdb4,
                                        CONCAT13(in_stack_fffffffffffffdb3,
                                                 CONCAT12(in_stack_fffffffffffffdb2,
                                                          in_stack_fffffffffffffdb0))),
                               (QChar)(char16_t)((ulong)in_stack_fffffffffffffdb8 >> 0x30),
                               in_stack_fffffffffffffdac);
        in_stack_fffffffffffffdb8 =
             (QString *)std::max<long_long>((longlong *)&local_138,&local_148);
        local_138 = (in_stack_fffffffffffffdb8->d).d;
        __length = extraout_RDX_00;
      }
      if (local_138 == (Data *)0x0) {
        local_169 = 0;
        local_1b4 = 1;
      }
      else {
        QStringView::truncate(&local_68,(char *)local_138,__length);
        local_1b4 = 0;
      }
    }
LAB_0042ea22:
    QFileInfo::~QFileInfo((QFileInfo *)0x42ea2f);
    if (local_1b4 != 0) {
      if (local_1b4 == 2) {
        local_169 = QTranslatorPrivate::do_load(in_RCX,in_R8,(QString *)directory_00);
      }
      QString::~QString((QString *)0x42ea98);
      QString::~QString((QString *)0x42eaa5);
      QString::~QString((QString *)0x42eab2);
      QString::~QString((QString *)0x42eabf);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (bool)(local_169 & 1);
      }
      __stack_chk_fail();
    }
    in_stack_fffffffffffffdb4 = CaseInsensitive;
  } while( true );
}

Assistant:

bool QTranslator::load(const QString & filename, const QString & directory,
                       const QString & search_delimiters,
                       const QString & suffix)
{
    Q_D(QTranslator);
    d->clear();

    QString prefix;
    if (QFileInfo(filename).isRelative()) {
        prefix = directory;
        if (prefix.size() && !prefix.endsWith(u'/'))
            prefix += u'/';
    }

    const QString suffixOrDotQM = suffix.isNull() ? dotQmLiteral() : suffix;
    QStringView fname(filename);
    QString realname;
    const QString delims = search_delimiters.isNull() ? QStringLiteral("_.") : search_delimiters;

    for (;;) {
        QFileInfo fi;

        realname = prefix + fname + suffixOrDotQM;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        realname = prefix + fname;
        fi.setFile(realname);
        if (fi.isReadable() && fi.isFile())
            break;

        qsizetype rightmost = 0;
        for (auto ch : delims)
            rightmost = std::max(rightmost, fname.lastIndexOf(ch));

        // no truncations? fail
        if (rightmost == 0)
            return false;

        fname.truncate(rightmost);
    }

    // realname is now the fully qualified name of a readable file.
    return d->do_load(realname, directory);
}